

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

Select * __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::selectify(wasm::If__
          (void *this,If *iff)

{
  Expression *two;
  ulong uVar1;
  bool bVar2;
  Select *pSVar3;
  undefined1 local_448 [8];
  EffectAnalyzer condition;
  EffectAnalyzer ifTrue;
  EffectAnalyzer ifFalse;
  
  two = iff->ifFalse;
  if (two != (Expression *)0x0) {
    uVar1 = (iff->ifTrue->type).id;
    if (((((1 < uVar1) && ((6 < uVar1 & (byte)uVar1) == 0)) && (uVar1 = (two->type).id, 1 < uVar1))
        && (((6 < uVar1 & (byte)uVar1) == 0 && ((iff->condition->type).id != 1)))) &&
       (bVar2 = tooCostlyToRunUnconditionally(*(PassOptions **)((long)this + 0xe0),iff->ifTrue,two),
       !bVar2)) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 *(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),iff->ifTrue);
      if ((ifTrue.readsMemory != false) ||
         (bVar2 = EffectAnalyzer::hasNonTrapSideEffects
                            ((EffectAnalyzer *)
                             &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count), bVar2)) {
        pSVar3 = (Select *)0x0;
      }
      else {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)
                   &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   *(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),iff->ifFalse
                  );
        if ((ifFalse.readsMemory != false) ||
           (bVar2 = EffectAnalyzer::hasNonTrapSideEffects
                              ((EffectAnalyzer *)
                               &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count), bVar2)) {
          pSVar3 = (Select *)0x0;
        }
        else {
          EffectAnalyzer::EffectAnalyzer
                    ((EffectAnalyzer *)local_448,*(PassOptions **)((long)this + 0xe0),
                     *(Module **)((long)this + 0xd0),iff->condition);
          bVar2 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)local_448,
                             (EffectAnalyzer *)
                             &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
          if ((bVar2) ||
             (bVar2 = EffectAnalyzer::invalidates
                                ((EffectAnalyzer *)local_448,
                                 (EffectAnalyzer *)
                                 &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count), bVar2)) {
            pSVar3 = (Select *)0x0;
          }
          else {
            ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 *(size_t *)((long)this + 0xd0);
            pSVar3 = Builder::makeSelect((Builder *)
                                         &ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                          ._M_node_count,iff->condition,iff->ifTrue,iff->ifFalse);
            if ((pSVar3->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.
                id != (iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type
                      .id) {
              *(undefined1 *)((long)this + 0xe9) = 1;
            }
          }
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_448);
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&ifFalse.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&ifFalse.danglingPop);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&ifFalse.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&ifFalse.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&ifFalse.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&ifFalse.features);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrue.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrue.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrue.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrue.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifTrue.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifTrue.features);
      return pSVar3;
    }
  }
  return (Select *)0x0;
}

Assistant:

Select* selectify(If* iff) {
        // Only an if-else can be turned into a select.
        if (!iff->ifFalse) {
          return nullptr;
        }
        if (!Properties::canEmitSelectWithArms(iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        if (iff->condition->type == Type::unreachable) {
          // An if with an unreachable condition may nonetheless have a type
          // that is not unreachable,
          //
          // (if (result i32) (unreachable) ..)
          //
          // Turning such an if into a select would change the type of the
          // expression, which would require updating types further up. Avoid
          // that, leaving dead code elimination to that dedicated pass.
          return nullptr;
        }
        // This is always helpful for code size, but can be a tradeoff with
        // performance as we run both code paths. So when shrinking we always
        // try to do this, but otherwise must consider more carefully.
        if (tooCostlyToRunUnconditionally(
              passOptions, iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        // Check if side effects allow this: we need to execute the two arms
        // unconditionally, and also to make the condition run last.
        EffectAnalyzer ifTrue(passOptions, *getModule(), iff->ifTrue);
        if (ifTrue.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer ifFalse(passOptions, *getModule(), iff->ifFalse);
        if (ifFalse.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer condition(passOptions, *getModule(), iff->condition);
        if (condition.invalidates(ifTrue) || condition.invalidates(ifFalse)) {
          return nullptr;
        }
        auto* select = Builder(*getModule())
                         .makeSelect(iff->condition, iff->ifTrue, iff->ifFalse);
        if (select->type != iff->type) {
          // If the select is more refined than the if it replaces, we must
          // propagate that outwards.
          refinalize = true;
        }
        return select;
      }